

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

void __thiscall
math::wide_integer::uintwide_t<64U,_unsigned_int,_void,_true>::eval_divide_by_single_limb
          (uintwide_t<64U,_unsigned_int,_void,_true> *this,limb_type short_denominator,
          unsigned_fast_type u_offset,uintwide_t<64U,_unsigned_int,_void,_true> *remainder)

{
  bool bVar1;
  uint uVar2;
  iterator it;
  uint *x;
  reference pvVar3;
  const_iterator puVar4;
  array<unsigned_int,_2UL> local_58;
  ulong local_50;
  reverse_iterator<unsigned_int_*> local_48;
  reverse_iterator<unsigned_int_*> local_40;
  reverse_iterator ri;
  ulong uStack_30;
  limb_type hi_part;
  double_limb_type long_numerator;
  uintwide_t<64U,_unsigned_int,_void,_true> *remainder_local;
  unsigned_fast_type u_offset_local;
  limb_type short_denominator_local;
  uintwide_t<64U,_unsigned_int,_void,_true> *this_local;
  
  uStack_30 = 0;
  ri.current._4_4_ = 0;
  it = detail::array_detail::array<unsigned_int,_2UL>::begin((array<unsigned_int,_2UL> *)this);
  x = detail::advance_and_point<unsigned_int*,unsigned_int>(it,2 - (int)u_offset);
  detail::iterator_detail::reverse_iterator<unsigned_int_*>::reverse_iterator(&local_40,x);
  while( true ) {
    local_48.current =
         (uint *)detail::array_detail::array<unsigned_int,_2UL>::rend
                           ((array<unsigned_int,_2UL> *)this);
    bVar1 = detail::iterator_detail::operator!=(&local_40,&local_48);
    if (!bVar1) break;
    pvVar3 = detail::iterator_detail::reverse_iterator<unsigned_int_*>::operator*(&local_40);
    uStack_30 = (ulong)*pvVar3 +
                (uStack_30 - (ulong)short_denominator * (ulong)ri.current._4_4_ << 0x20);
    local_50 = uStack_30 / short_denominator;
    uVar2 = detail::make_lo<unsigned_int,unsigned_long>(&local_50);
    pvVar3 = detail::iterator_detail::reverse_iterator<unsigned_int_*>::operator*(&local_40);
    *pvVar3 = uVar2;
    pvVar3 = detail::iterator_detail::reverse_iterator<unsigned_int_*>::operator*(&local_40);
    ri.current._4_4_ = *pvVar3;
    detail::iterator_detail::reverse_iterator<unsigned_int_*>::operator++(&local_40);
  }
  if (remainder != (uintwide_t<64U,_unsigned_int,_void,_true> *)0x0) {
    puVar4 = detail::array_detail::array<unsigned_int,_2UL>::cbegin
                       ((array<unsigned_int,_2UL> *)this);
    uintwide_t<64u,unsigned_int,void,true>::uintwide_t<unsigned_int>(unsigned_int,std::
    enable_if<(std::is_integral<unsigned_int>::value&&std::is_unsigned<unsigned_int>::value)&&(std::
    numeric_limits<unsigned_int>::digits<=std::numeric_limits<unsigned_int>::digits),void>::type__
              (&local_58,
               (uint)((ulong)*puVar4 +
                      (uStack_30 - (ulong)short_denominator * (ulong)ri.current._4_4_ << 0x20) >>
                     0x20),
               (enable_if_t<(std::is_integral<unsigned_int>::value_&&_std::is_unsigned<unsigned_int>::value_&&_(std::numeric_limits<unsigned_int>::digits_<__std::numeric_limits<limb_type>::digits))>
                *)0x0);
    *&(remainder->values).super_array<unsigned_int,_2UL>.elems = local_58.elems;
  }
  return;
}

Assistant:

constexpr auto eval_divide_by_single_limb(const limb_type          short_denominator,
                                              const unsigned_fast_type u_offset,
                                                    uintwide_t*        remainder) -> void
    {
      // The denominator has one single limb.
      // Use a one-dimensional division algorithm.

      auto long_numerator = double_limb_type { };
      auto hi_part        = static_cast<limb_type>(UINT8_C(0));

      {
        reverse_iterator
          ri
          {
            detail::advance_and_point
            (
              values.begin(),
              static_cast<size_t>(number_of_limbs - static_cast<size_t>(u_offset))
            )
          };

        for( ; ri != values.rend(); ++ri) // NOLINT(altera-id-dependent-backward-branch)
        {
          long_numerator =
            static_cast<double_limb_type>
            (
               *ri
             + static_cast<double_limb_type>
               (
                    static_cast<double_limb_type>
                    (
                        long_numerator
                      - static_cast<double_limb_type>(static_cast<double_limb_type>(short_denominator) * hi_part)
                    )
                 << static_cast<unsigned>(std::numeric_limits<limb_type>::digits)
               )
            );

          *ri = detail::make_lo<limb_type>(static_cast<double_limb_type>(long_numerator / short_denominator));

          hi_part = *ri;
        }
      }

      if(remainder != nullptr)
      {
        long_numerator =
          static_cast<double_limb_type>
          (
             static_cast<double_limb_type>(*values.cbegin())
           + static_cast<double_limb_type>
             (
                  static_cast<double_limb_type>
                  (
                    long_numerator - static_cast<double_limb_type>(static_cast<double_limb_type>(short_denominator) * hi_part)
                  )
               << static_cast<unsigned>(std::numeric_limits<limb_type>::digits)
             )
          );

        *remainder =
          static_cast<limb_type>
          (
            long_numerator >> static_cast<unsigned>(std::numeric_limits<limb_type>::digits)
          );
      }
    }